

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataarray.h
# Opt level: O0

void __thiscall soplex::DataArray<bool>::DataArray(DataArray<bool> *this,DataArray<bool> *old)

{
  int *in_RSI;
  DataArray<bool> *in_RDI;
  
  in_RDI->thesize = *in_RSI;
  in_RDI->themax = in_RSI[1];
  in_RDI->data = (bool *)0x0;
  in_RDI->memFactor = *(Real *)(in_RSI + 4);
  max(in_RDI);
  spx_alloc<bool*>((bool **)this,old._4_4_);
  if (in_RDI->thesize != 0) {
    memcpy(in_RDI->data,*(void **)(in_RSI + 2),(ulong)(uint)in_RDI->thesize);
  }
  return;
}

Assistant:

DataArray(const DataArray& old)
      : thesize(old.thesize)
      , themax(old.themax)
      , data(nullptr)
      , memFactor(old.memFactor)
   {
      spx_alloc(data, max());

      assert(thesize >= 0);

      if(thesize)
         memcpy(data, old.data, (unsigned int)thesize * sizeof(T));

      assert(isConsistent());
   }